

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O0

void __thiscall GLFlat::Draw(GLFlat *this,int pass,bool trans)

{
  bool bVar1;
  int rellight;
  float thresh;
  bool local_41;
  bool local_39;
  int a;
  int rel;
  bool trans_local;
  int pass_local;
  GLFlat *this_local;
  
  rellight = getExtraLight();
  FIntCVar::operator_cast_to_int(&gl_breaksec);
  switch(pass) {
  case 0:
  case 2:
    gl_SetColor(this->lightlevel,rellight,&this->Colormap,1.0,false);
    gl_SetFog(this->lightlevel,rellight,&this->Colormap,false);
    if (this->sector->special == 0x5a) {
      FRenderState::SetMaterial(&gl_RenderState,this->gltexture,3,0,-1,false);
      local_41 = true;
      if (pass != 0) {
        local_41 = (uint)this->dynlightindex < 0x80000000;
      }
      DrawSkyboxSector(this,pass,local_41);
    }
    else {
      FRenderState::SetMaterial(&gl_RenderState,this->gltexture,0,0,-1,false);
      gl_SetPlaneTextureRotation(&this->plane,this->gltexture);
      local_39 = true;
      if (pass != 0) {
        local_39 = (uint)this->dynlightindex < 0x80000000;
      }
      DrawSubsectors(this,pass,local_39,false);
      FRenderState::EnableTextureMatrix(&gl_RenderState,false);
    }
    break;
  case 1:
    if ((!trans) || (this->gltexture != (FMaterial *)0x0)) {
      ProcessLights(this,trans);
    }
    break;
  case 4:
    if (this->renderstyle == STYLE_Add) {
      FRenderState::BlendFunc(&gl_RenderState,0x302,1);
    }
    gl_SetColor(this->lightlevel,rellight,&this->Colormap,this->alpha,false);
    gl_SetFog(this->lightlevel,rellight,&this->Colormap,false);
    if (this->gltexture == (FMaterial *)0x0) {
      FRenderState::AlphaFunc(&gl_RenderState,0x206,0.0);
      FRenderState::EnableTexture(&gl_RenderState,false);
      DrawSubsectors(this,pass,false,true);
      FRenderState::EnableTexture(&gl_RenderState,true);
    }
    else {
      bVar1 = FMaterial::GetTransparent(this->gltexture);
      if (bVar1) {
        FRenderState::AlphaFunc(&gl_RenderState,0x206,0.0);
      }
      else {
        thresh = FFloatCVar::operator_cast_to_float(&gl_mask_threshold);
        FRenderState::AlphaFunc(&gl_RenderState,0x206,thresh);
      }
      FRenderState::SetMaterial(&gl_RenderState,this->gltexture,0,0,-1,false);
      gl_SetPlaneTextureRotation(&this->plane,this->gltexture);
      DrawSubsectors(this,pass,(bool)((gl.legacyMode ^ 0xffU) & 1),true);
      FRenderState::EnableTextureMatrix(&gl_RenderState,false);
    }
    if (this->renderstyle == STYLE_Add) {
      FRenderState::BlendFunc(&gl_RenderState,0x302,0x303);
    }
    break;
  case 7:
  case 9:
  case 10:
    DrawLightsCompat(this,pass);
    break;
  case 8:
    FRenderState::SetMaterial(&gl_RenderState,this->gltexture,0,0,-1,false);
    gl_SetPlaneTextureRotation(&this->plane,this->gltexture);
    DrawSubsectors(this,pass,false,false);
    FRenderState::EnableTextureMatrix(&gl_RenderState,false);
  }
  return;
}

Assistant:

void GLFlat::Draw(int pass, bool trans)	// trans only has meaning for GLPASS_LIGHTSONLY
{
	int rel = getExtraLight();

#ifdef _DEBUG
	if (sector->sectornum == gl_breaksec)
	{
		int a = 0;
	}
#endif


	switch (pass)
	{
	case GLPASS_PLAIN:			// Single-pass rendering
	case GLPASS_ALL:			// Same, but also creates the dynlight data.
		gl_SetColor(lightlevel, rel, Colormap,1.0f);
		gl_SetFog(lightlevel, rel, &Colormap, false);
		if (sector->special != GLSector_Skybox)
		{
			gl_RenderState.SetMaterial(gltexture, CLAMP_NONE, 0, -1, false);
			gl_SetPlaneTextureRotation(&plane, gltexture);
			DrawSubsectors(pass, (pass == GLPASS_ALL || dynlightindex > -1), false);
			gl_RenderState.EnableTextureMatrix(false);
		}
		else
		{
			gl_RenderState.SetMaterial(gltexture, CLAMP_XY, 0, -1, false);
			DrawSkyboxSector(pass, (pass == GLPASS_ALL || dynlightindex > -1));
		}
		break;

	case GLPASS_LIGHTSONLY:
		if (!trans || gltexture)
		{
			ProcessLights(trans);
		}
		break;

	case GLPASS_TRANSLUCENT:
		if (renderstyle==STYLE_Add) gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE);
		gl_SetColor(lightlevel, rel, Colormap, alpha);
		gl_SetFog(lightlevel, rel, &Colormap, false);
		if (!gltexture)	
		{
			gl_RenderState.AlphaFunc(GL_GEQUAL, 0.f);
			gl_RenderState.EnableTexture(false);
			DrawSubsectors(pass, false, true);
			gl_RenderState.EnableTexture(true);
		}
		else 
		{
			if (!gltexture->GetTransparent()) gl_RenderState.AlphaFunc(GL_GEQUAL, gl_mask_threshold);
			else gl_RenderState.AlphaFunc(GL_GEQUAL, 0.f);
			gl_RenderState.SetMaterial(gltexture, CLAMP_NONE, 0, -1, false);
			gl_SetPlaneTextureRotation(&plane, gltexture);
			DrawSubsectors(pass, !gl.legacyMode, true);
			gl_RenderState.EnableTextureMatrix(false);
		}
		if (renderstyle==STYLE_Add) gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
		break;

	case GLPASS_LIGHTTEX:
	case GLPASS_LIGHTTEX_ADDITIVE:
	case GLPASS_LIGHTTEX_FOGGY:
		DrawLightsCompat(pass);
		break;

	case GLPASS_TEXONLY:
		gl_RenderState.SetMaterial(gltexture, CLAMP_NONE, 0, -1, false);
		gl_SetPlaneTextureRotation(&plane, gltexture);
		DrawSubsectors(pass, false, false);
		gl_RenderState.EnableTextureMatrix(false);
		break;
	}
}